

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStateDirectory.cxx
# Opt level: O0

bool __thiscall cmStateDirectory::GetPropertyAsBool(cmStateDirectory *this,string *prop)

{
  bool bVar1;
  cmValue val;
  string *prop_local;
  cmStateDirectory *this_local;
  
  val = GetProperty(this,prop);
  bVar1 = cmIsOn(val);
  return bVar1;
}

Assistant:

bool cmStateDirectory::GetPropertyAsBool(const std::string& prop) const
{
  return cmIsOn(this->GetProperty(prop));
}